

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,VariableDeclaration *variable_declaration)

{
  char *pcVar1;
  PrimitiveSimpleObject *this_00;
  PrimitiveArrayObject *this_01;
  ArrayType *local_e8;
  string local_b0;
  Symbol local_90;
  string local_70;
  Symbol local_50;
  size_t local_20;
  size_t index;
  VariableDeclaration *variable_declaration_local;
  NewFunctionProcessingVisitor *this_local;
  
  index = (size_t)variable_declaration;
  variable_declaration_local = (VariableDeclaration *)this;
  pcVar1 = (char *)std::__cxx11::string::back();
  if (*pcVar1 == ']') {
    this_01 = (PrimitiveArrayObject *)operator_new(0x10);
    if (*(long *)(index + 0x10) == 0) {
      local_e8 = (ArrayType *)0x0;
    }
    else {
      local_e8 = (ArrayType *)
                 __dynamic_cast(*(long *)(index + 0x10),&Type::typeinfo,&ArrayType::typeinfo,0);
    }
    PrimitiveArrayObject::PrimitiveArrayObject(this_01,local_e8);
    local_20 = FrameEmulator::AllocVariable(&this->frame_,(PrimitiveObject *)this_01);
  }
  else {
    this_00 = (PrimitiveSimpleObject *)operator_new(0x18);
    PrimitiveSimpleObject::PrimitiveSimpleObject(this_00,*(Type **)(index + 0x10));
    local_20 = FrameEmulator::AllocVariable(&this->frame_,(PrimitiveObject *)this_00);
  }
  std::__cxx11::string::string((string *)&local_70,(string *)(index + 0x18));
  Symbol::Symbol(&local_50,&local_70);
  FunctionTable::CreateVariable(&this->table_,&local_50);
  Symbol::~Symbol(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_b0,(string *)(index + 0x18));
  Symbol::Symbol(&local_90,&local_b0);
  FunctionTable::Put(&this->table_,&local_90,(int)local_20);
  Symbol::~Symbol(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(
    VariableDeclaration* variable_declaration) {
  size_t index;

  if (variable_declaration->type_->type_name_.back() != ']') {
    index = frame_.AllocVariable(
        new PrimitiveSimpleObject(variable_declaration->type_));
  } else {
    index = frame_.AllocVariable(new PrimitiveArrayObject(
        dynamic_cast<ArrayType*>(variable_declaration->type_)));
  }

  table_.CreateVariable(Symbol(variable_declaration->variable_name_));
  table_.Put(Symbol(variable_declaration->variable_name_), index);
}